

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Electromagnetic_Emission_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pEVar3;
  KINT32 Value;
  string local_2a0 [32];
  __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
  local_280;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Electromagnetic_Emission_PDU *local_18;
  Electromagnetic_Emission_PDU *this_local;
  
  local_18 = this;
  this_local = (Electromagnetic_Emission_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Electromagnetic Emission PDU-\n");
  poVar2 = std::operator<<(poVar2,"Emitting Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_EmittingEntityID);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_250,&this->m_EventID);
  UTILS::IndentString(&local_230,&local_250,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"State Update Indicator:     ");
  DATA_TYPE::ENUMS::GetEnumAsStringStateUpdateIndicator_abi_cxx11_
            ((KString *)&citr,(ENUMS *)(ulong)this->m_ui8StateUpdateIndicator,Value);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Emission Systems: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumberOfEmissionSystems);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
            ::begin(&this->m_vEmissionSystem);
  local_280._M_current =
       (EmissionSystem *)
       std::
       vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
       end(&this->m_vEmissionSystem);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_280);
    if (!bVar1) break;
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
             ::operator->(&citrEnd);
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_2a0);
    std::operator<<(local_190,local_2a0);
    std::__cxx11::string::~string(local_2a0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Electromagnetic_Emission_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Electromagnetic Emission PDU-\n"
       << "Emitting Entity ID:\n"
       << IndentString( m_EmittingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "State Update Indicator:     " << GetEnumAsStringStateUpdateIndicator( m_ui8StateUpdateIndicator ) << "\n"
       << "Number Of Emission Systems: " << ( KUINT16 )m_ui8NumberOfEmissionSystems  << "\n";

    vector<EmissionSystem>::const_iterator citr = m_vEmissionSystem.begin();
    vector<EmissionSystem>::const_iterator citrEnd = m_vEmissionSystem.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}